

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void RGB24MirrorRow_SSSE3(uint8_t *src_rgb24,uint8_t *dst_rgb24,int width)

{
  bool bVar1;
  uvec8 auVar2;
  uvec8 auVar3;
  long lVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar3 = libyuv::kShuffleMirrorRGB1;
  auVar2 = libyuv::kShuffleMirrorRGB0;
  lVar4 = (long)width;
  pauVar6 = (undefined1 (*) [16])(src_rgb24 + width * 3);
  do {
    auVar7 = pshufb(pauVar6[-3],(undefined1  [16])auVar2);
    auVar8 = pshufb(*(undefined1 (*) [16])(pauVar6[-3] + 0xf),(undefined1  [16])auVar2);
    auVar9 = pshufb(*(undefined1 (*) [16])(pauVar6[-2] + 0xe),(undefined1  [16])auVar2);
    auVar10 = pshufb(pauVar6[-1],(undefined1  [16])auVar3);
    *(undefined1 (*) [16])(dst_rgb24 + 0x20) = auVar7;
    *(undefined1 (*) [16])(dst_rgb24 + 0x11) = auVar8;
    *(undefined1 (*) [16])(dst_rgb24 + 2) = auVar9;
    *(long *)dst_rgb24 = auVar10._0_8_;
    dst_rgb24 = dst_rgb24 + 0x30;
    lVar5 = lVar4 + -0x10;
    bVar1 = 0xf < lVar4;
    lVar4 = lVar5;
    pauVar6 = pauVar6 + -3;
  } while (lVar5 != 0 && bVar1);
  return;
}

Assistant:

void RGB24MirrorRow_SSSE3(const uint8_t* src_rgb24,
                          uint8_t* dst_rgb24,
                          int width) {
  intptr_t temp_width = (intptr_t)(width);
  src_rgb24 += width * 3 - 48;
  asm volatile(
      "movdqa      %3,%%xmm4                     \n"
      "movdqa      %4,%%xmm5                     \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"  // first 5
      "movdqu      15(%0),%%xmm1                 \n"  // next 5
      "movdqu      30(%0),%%xmm2                 \n"  // next 5
      "movdqu      32(%0),%%xmm3                 \n"  // last 1 special
      "pshufb      %%xmm4,%%xmm0                 \n"
      "pshufb      %%xmm4,%%xmm1                 \n"
      "pshufb      %%xmm4,%%xmm2                 \n"
      "pshufb      %%xmm5,%%xmm3                 \n"
      "lea         -0x30(%0),%0                  \n"
      "movdqu      %%xmm0,32(%1)                 \n"  // last 5
      "movdqu      %%xmm1,17(%1)                 \n"  // next 5
      "movdqu      %%xmm2,2(%1)                  \n"  // next 5
      "movlpd      %%xmm3,0(%1)                  \n"  // first 1
      "lea         0x30(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_rgb24),          // %0
        "+r"(dst_rgb24),          // %1
        "+r"(temp_width)          // %2
      : "m"(kShuffleMirrorRGB0),  // %3
        "m"(kShuffleMirrorRGB1)   // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}